

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_medium.h
# Opt level: O0

bool __thiscall constant_medium::hit(constant_medium *this,ray *r,interval ray_t,hit_record *rec)

{
  double dVar1;
  double __x;
  interval iVar2;
  uint uVar3;
  int iVar4;
  element_type *peVar5;
  vec3 *this_00;
  vec3 local_178;
  point3 local_160;
  double local_148;
  double hit_distance;
  double distance_inside_boundary;
  double ray_length;
  double local_128;
  undefined4 local_11c;
  interval local_118;
  undefined1 local_f8 [8];
  hit_record rec2;
  hit_record rec1;
  hit_record *rec_local;
  ray *r_local;
  constant_medium *this_local;
  interval ray_t_local;
  
  hit_record::hit_record((hit_record *)&rec2.front_face);
  hit_record::hit_record((hit_record *)local_f8);
  peVar5 = std::__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->boundary);
  local_118 = interval::universe;
  iVar2 = local_118;
  local_118.max = interval::universe.max;
  dVar1 = local_118.max;
  local_118 = iVar2;
  uVar3 = (*peVar5->_vptr_hittable[2])(interval::universe.min._0_4_,dVar1,peVar5,r,&rec2.front_face)
  ;
  if ((uVar3 & 1) == 0) {
    ray_t_local.max._7_1_ = false;
  }
  else {
    peVar5 = std::__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->boundary);
    interval::interval((interval *)&ray_length,
                       (double)rec1.mat.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi + 0.0001,INFINITY);
    iVar4 = (*peVar5->_vptr_hittable[2])(ray_length._0_4_,local_128,peVar5,r,local_f8);
    if ((((byte)iVar4 ^ 0xff) & 1) == 0) {
      if ((double)rec1.mat.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi < ray_t.min) {
        rec1.mat.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ray_t.min;
      }
      if (ray_t.max <
          (double)rec2.mat.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi) {
        rec2.mat.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ray_t.max;
      }
      if ((double)rec1.mat.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi <
          (double)rec2.mat.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi) {
        if ((double)rec1.mat.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi < 0.0) {
          rec1.mat.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        this_00 = ray::direction(r);
        distance_inside_boundary = vec3::length(this_00);
        hit_distance = ((double)rec2.mat.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi -
                       (double)rec1.mat.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi) * distance_inside_boundary;
        dVar1 = this->neg_inv_density;
        __x = random_double();
        local_148 = log(__x);
        local_148 = dVar1 * local_148;
        if (local_148 <= hit_distance) {
          rec->t = (double)rec1.mat.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + local_148 / distance_inside_boundary;
          ray::at(&local_160,r,rec->t);
          (rec->p).e[2] = local_160.e[2];
          (rec->p).e[0] = local_160.e[0];
          (rec->p).e[1] = local_160.e[1];
          vec3::vec3(&local_178,1.0,0.0,0.0);
          (rec->normal).e[0] = local_178.e[0];
          (rec->normal).e[1] = local_178.e[1];
          (rec->normal).e[2] = local_178.e[2];
          rec->front_face = true;
          std::shared_ptr<material>::operator=(&rec->mat,&this->phase_function);
          ray_t_local.max._7_1_ = true;
        }
        else {
          ray_t_local.max._7_1_ = false;
        }
      }
      else {
        ray_t_local.max._7_1_ = false;
      }
    }
    else {
      ray_t_local.max._7_1_ = false;
    }
  }
  local_11c = 1;
  hit_record::~hit_record((hit_record *)local_f8);
  hit_record::~hit_record((hit_record *)&rec2.front_face);
  return ray_t_local.max._7_1_;
}

Assistant:

bool hit(const ray& r, interval ray_t, hit_record& rec) const override {
        hit_record rec1, rec2;

        if (!boundary->hit(r, interval::universe, rec1))
            return false;

        if (!boundary->hit(r, interval(rec1.t+0.0001, infinity), rec2))
            return false;

        if (rec1.t < ray_t.min) rec1.t = ray_t.min;
        if (rec2.t > ray_t.max) rec2.t = ray_t.max;

        if (rec1.t >= rec2.t)
            return false;

        if (rec1.t < 0)
            rec1.t = 0;

        auto ray_length = r.direction().length();
        auto distance_inside_boundary = (rec2.t - rec1.t) * ray_length;
        auto hit_distance = neg_inv_density * std::log(random_double());

        if (hit_distance > distance_inside_boundary)
            return false;

        rec.t = rec1.t + hit_distance / ray_length;
        rec.p = r.at(rec.t);

        rec.normal = vec3(1,0,0);  // arbitrary
        rec.front_face = true;     // also arbitrary
        rec.mat = phase_function;

        return true;
    }